

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.cpp
# Opt level: O1

int __thiscall ncnn::Quantize::forward(Quantize *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int _w;
  uint _h;
  uint _c;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  float fVar14;
  
  iVar9 = bottom_blob->dims;
  _w = bottom_blob->w;
  _h = bottom_blob->h;
  _c = bottom_blob->c;
  if (iVar9 == 3) {
    Mat::create(top_blob,_w,_h,_c,1,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    if ((int)_c < 1) {
      return 0;
    }
    uVar12 = 0;
    do {
      uVar11 = 0;
      if (this->scale_data_size != 1) {
        uVar11 = uVar12 & 0xffffffff;
      }
      if (0 < (int)(_h * _w)) {
        fVar1 = *(float *)((long)(this->scale_data).data + uVar11 * 4);
        sVar5 = top_blob->cstep;
        sVar6 = bottom_blob->cstep;
        sVar7 = bottom_blob->elemsize;
        pvVar3 = bottom_blob->data;
        sVar8 = top_blob->elemsize;
        pvVar4 = top_blob->data;
        lVar13 = 0;
        do {
          fVar14 = roundf(*(float *)((long)pvVar3 + lVar13 * 4 + sVar6 * sVar7 * uVar12) * fVar1);
          iVar9 = (int)fVar14;
          if (iVar9 < -0x7e) {
            iVar9 = -0x7f;
          }
          if (0x7e < iVar9) {
            iVar9 = 0x7f;
          }
          *(char *)((long)pvVar4 + lVar13 + sVar5 * sVar8 * uVar12) = (char)iVar9;
          lVar13 = lVar13 + 1;
        } while (_h * _w != (int)lVar13);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != _c);
  }
  else if (iVar9 == 2) {
    Mat::create(top_blob,_w,_h,1,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    if (0 < (int)_h) {
      uVar12 = 0;
      do {
        uVar11 = 0;
        if (this->scale_data_size != 1) {
          uVar11 = uVar12 & 0xffffffff;
        }
        if (0 < _w) {
          fVar1 = *(float *)((long)(this->scale_data).data + uVar11 * 4);
          iVar9 = top_blob->w;
          iVar2 = bottom_blob->w;
          sVar5 = bottom_blob->elemsize;
          pvVar3 = bottom_blob->data;
          sVar6 = top_blob->elemsize;
          pvVar4 = top_blob->data;
          lVar13 = 0;
          do {
            fVar14 = roundf(*(float *)((long)pvVar3 + lVar13 * 4 + sVar5 * uVar12 * (long)iVar2) *
                            fVar1);
            iVar10 = (int)fVar14;
            if (iVar10 < -0x7e) {
              iVar10 = -0x7f;
            }
            if (0x7e < iVar10) {
              iVar10 = 0x7f;
            }
            *(char *)((long)pvVar4 + lVar13 + sVar6 * uVar12 * (long)iVar9) = (char)iVar10;
            lVar13 = lVar13 + 1;
          } while (_w != (int)lVar13);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != _h);
    }
  }
  else if (iVar9 == 1) {
    Mat::create(top_blob,_w,1,opt->blob_allocator);
    pvVar3 = top_blob->data;
    if (pvVar3 == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    if (0 < _w) {
      fVar1 = *(this->scale_data).data;
      pvVar4 = bottom_blob->data;
      lVar13 = 0;
      do {
        fVar14 = roundf(*(float *)((long)pvVar4 + lVar13 * 4) * fVar1);
        iVar9 = (int)fVar14;
        if (iVar9 < -0x7e) {
          iVar9 = -0x7f;
        }
        if (0x7e < iVar9) {
          iVar9 = 0x7f;
        }
        *(char *)((long)pvVar3 + lVar13) = (char)iVar9;
        lVar13 = lVar13 + 1;
      } while (_w != (int)lVar13);
    }
  }
  return 0;
}

Assistant:

int Quantize::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int dims = bottom_blob.dims;
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int channels = bottom_blob.c;

    if (dims == 1)
    {
        top_blob.create(w, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        // assert scale_data_size == 1

        const float* ptr = bottom_blob;
        signed char* s8ptr = top_blob;

        const float scale = scale_data[0];

        quantize(ptr, s8ptr, scale, w);
    }

    if (dims == 2)
    {
        top_blob.create(w, h, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            const float* ptr = bottom_blob.row(i);
            signed char* s8ptr = top_blob.row<signed char>(i);

            const float scale = scale_data_size == 1 ? scale_data[0] : scale_data[i];

            quantize(ptr, s8ptr, scale, w);
        }
    }

    if (dims == 3)
    {
        top_blob.create(w, h, channels, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            signed char* s8ptr = top_blob.channel(q);

            const float scale = scale_data_size == 1 ? scale_data[0] : scale_data[q];

            quantize(ptr, s8ptr, scale, w * h);
        }
    }

    return 0;
}